

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpTcpEventLoop.cpp
# Opt level: O0

void __thiscall sznet::net::KcpTcpEventLoop::handleUdpRead(KcpTcpEventLoop *this,Timestamp param_1)

{
  uint uVar1;
  bool bVar2;
  sz_sock fd;
  uint32_t uVar3;
  sockaddr *addr;
  size_t sVar4;
  LogStream *pLVar5;
  pointer ppVar6;
  element_type *this_00;
  pointer ppVar7;
  pointer ppVar8;
  element_type *this_01;
  bool bVar9;
  SourceFile file;
  SourceFile file_00;
  bool local_2041;
  _Self local_2028;
  _Self local_2020;
  _Self local_2018;
  iterator fTcpIter;
  iterator fKcpIter;
  _Node_iterator_base<std::pair<const_sockaddr_in,_std::shared_ptr<sznet::net::KcpConnection>_>,_true>
  local_2000;
  iterator fAddrConnIter;
  undefined4 local_1ff0;
  Logger local_1fe8;
  undefined1 local_1008 [12];
  Logger local_ff8;
  sz_ssize_t local_28;
  sz_ssize_t n;
  KcpTcpEventLoop *pKStack_18;
  int savedErrno;
  KcpTcpEventLoop *this_local;
  Timestamp param_1_local;
  
  pKStack_18 = this;
  this_local = (KcpTcpEventLoop *)param_1.m_microSecondsSinceEpoch;
  EventLoop::assertInLoopThread(&this->super_EventLoop);
  n._4_4_ = 0;
  local_28 = 0;
  do {
    fd = Socket::fd(&this->m_udpSocket);
    addr = sockets::sz_sockaddr_cast(&this->m_curRecvAddr);
    local_28 = Buffer::recvFrom(&this->m_inputBuffer,fd,addr,(int *)((long)&n + 4));
    local_2041 = local_28 == -1 && n._4_4_ == 4;
  } while (local_2041);
  if (local_28 < 0) {
    bVar9 = sockets::sz_wouldblock();
    if (!bVar9) {
      Logger::SourceFile::SourceFile<106>
                ((SourceFile *)local_1008,
                 (char (*) [106])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpTcpEventLoop.cpp"
                );
      file._12_4_ = 0;
      file.m_data = (char *)local_1008._0_8_;
      file.m_size = local_1008._8_4_;
      Logger::Logger(&local_ff8,file,0x7e,false);
      pLVar5 = Logger::stream(&local_ff8);
      LogStream::operator<<(pLVar5,"KcpTcpEventLoop::handleUdpRead");
      Logger::~Logger(&local_ff8);
      return;
    }
  }
  else {
    (this->m_netStatInfo).m_recvBytes = local_28 + (this->m_netStatInfo).m_recvBytes;
  }
  sVar4 = Buffer::readableBytes(&this->m_inputBuffer);
  if (sVar4 == 0) {
    Logger::SourceFile::SourceFile<106>
              ((SourceFile *)&fAddrConnIter,
               (char (*) [106])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpTcpEventLoop.cpp"
              );
    file_00._12_4_ = 0;
    file_00.m_data =
         (char *)fAddrConnIter.
                 super__Node_iterator_base<std::pair<const_sockaddr_in,_std::shared_ptr<sznet::net::KcpConnection>_>,_true>
                 ._M_cur;
    file_00.m_size = local_1ff0;
    Logger::Logger(&local_1fe8,file_00,0x85,ERROR);
    pLVar5 = Logger::stream(&local_1fe8);
    LogStream::operator<<(pLVar5,"m_inputBuffer.recvFrom return zero");
    Logger::~Logger(&local_1fe8);
  }
  else {
    local_2000._M_cur =
         (__node_type *)
         std::
         unordered_map<sockaddr_in,_std::shared_ptr<sznet::net::KcpConnection>,_sznet::net::KcpTcpEventLoop::sockaddrInKeyHash,_sznet::net::KcpTcpEventLoop::sockaddrInKeyEqual,_std::allocator<std::pair<const_sockaddr_in,_std::shared_ptr<sznet::net::KcpConnection>_>_>_>
         ::find(&this->m_addrConns,&this->m_curRecvAddr);
    fKcpIter._M_node =
         (_Base_ptr)
         std::
         unordered_map<sockaddr_in,_std::shared_ptr<sznet::net::KcpConnection>,_sznet::net::KcpTcpEventLoop::sockaddrInKeyHash,_sznet::net::KcpTcpEventLoop::sockaddrInKeyEqual,_std::allocator<std::pair<const_sockaddr_in,_std::shared_ptr<sznet::net::KcpConnection>_>_>_>
         ::end(&this->m_addrConns);
    bVar2 = std::__detail::operator==
                      (&local_2000,
                       (_Node_iterator_base<std::pair<const_sockaddr_in,_std::shared_ptr<sznet::net::KcpConnection>_>,_true>
                        *)&fKcpIter);
    bVar9 = true;
    if (!bVar2) {
      sVar4 = Buffer::readableBytes(&this->m_inputBuffer);
      bVar9 = sVar4 < 0x18;
    }
    if (bVar9) {
      handleNewUdpMessage(this);
      Buffer::retrieveAll(&this->m_inputBuffer);
    }
    else {
      ppVar6 = std::__detail::
               _Node_iterator<std::pair<const_sockaddr_in,_std::shared_ptr<sznet::net::KcpConnection>_>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_sockaddr_in,_std::shared_ptr<sznet::net::KcpConnection>_>,_false,_true>
                             *)&local_2000);
      this_00 = std::
                __shared_ptr_access<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&ppVar6->second);
      uVar3 = KcpConnection::getConvId(this_00);
      this->m_curConv = uVar3;
      fTcpIter._M_node =
           (_Base_ptr)
           std::
           map<unsigned_int,_std::shared_ptr<sznet::net::KcpConnection>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::KcpConnection>_>_>_>
           ::find(&this->m_kcpConnections,&this->m_curConv);
      local_2018._M_node =
           (_Base_ptr)
           std::
           map<unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>_>_>
           ::find(&this->m_tcpConnections,&this->m_curConv);
      local_2020._M_node =
           (_Base_ptr)
           std::
           map<unsigned_int,_std::shared_ptr<sznet::net::KcpConnection>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::KcpConnection>_>_>_>
           ::end(&this->m_kcpConnections);
      bVar9 = std::operator!=((_Self *)&fTcpIter,&local_2020);
      if (!bVar9) {
        __assert_fail("fKcpIter != m_kcpConnections.end()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpTcpEventLoop.cpp"
                      ,0x93,"void sznet::net::KcpTcpEventLoop::handleUdpRead(Timestamp)");
      }
      local_2028._M_node =
           (_Base_ptr)
           std::
           map<unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>_>_>
           ::end(&this->m_tcpConnections);
      bVar9 = std::operator!=(&local_2018,&local_2028);
      if (!bVar9) {
        __assert_fail("fTcpIter != m_tcpConnections.end()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpTcpEventLoop.cpp"
                      ,0x94,"void sznet::net::KcpTcpEventLoop::handleUdpRead(Timestamp)");
      }
      ppVar7 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::KcpConnection>_>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::KcpConnection>_>_>
                             *)&fTcpIter);
      uVar1 = ppVar7->first;
      ppVar8 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>_>
               ::operator->(&local_2018);
      if (uVar1 != ppVar8->first) {
        __assert_fail("fKcpIter->first == fTcpIter->first",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpTcpEventLoop.cpp"
                      ,0x95,"void sznet::net::KcpTcpEventLoop::handleUdpRead(Timestamp)");
      }
      ppVar8 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>_>
               ::operator->(&local_2018);
      this_01 = std::
                __shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&ppVar8->second);
      bVar9 = TcpConnection::connected(this_01);
      if (!bVar9) {
        __assert_fail("fTcpIter->second->connected()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpTcpEventLoop.cpp"
                      ,0x96,"void sznet::net::KcpTcpEventLoop::handleUdpRead(Timestamp)");
      }
      ppVar8 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>_>
               ::operator->(&local_2018);
      std::shared_ptr<sznet::net::TcpConnection>::operator=(&this->m_curTcpConn,&ppVar8->second);
      ppVar7 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::KcpConnection>_>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::KcpConnection>_>_>
                             *)&fTcpIter);
      std::shared_ptr<sznet::net::KcpConnection>::operator=(&this->m_curKcpConn,&ppVar7->second);
      handleKcpMessage(this);
      Buffer::retrieveAll(&this->m_inputBuffer);
    }
  }
  return;
}

Assistant:

void KcpTcpEventLoop::handleUdpRead(Timestamp)
{
	assertInLoopThread();
	int savedErrno = 0;
	sz_ssize_t n = 0;
	do
	{
		n = m_inputBuffer.recvFrom(m_udpSocket.fd(), sockets::sz_sockaddr_cast(&m_curRecvAddr), &savedErrno);
	} while (n == -1 && savedErrno == sz_err_eintr);
	if (n >= 0)
	{
		m_netStatInfo.m_recvBytes += n;
	}
	else
	{
		if (!sockets::sz_wouldblock())
		{
			LOG_SYSERR << "KcpTcpEventLoop::handleUdpRead";
			return;
		}
	}

	if (m_inputBuffer.readableBytes() == 0)
	{
		LOG_ERROR << "m_inputBuffer.recvFrom return zero";
		return;
	}
	// 需要考虑客户端与服务器异步原因造成，回执结果丢包 | 客户端收到前超时再次发送握手校验
	auto fAddrConnIter = m_addrConns.find(m_curRecvAddr);
	if (fAddrConnIter == m_addrConns.end() || m_inputBuffer.readableBytes() < KcpConnection::kKCP_OVERHEAD_SIZE)
	{
		handleNewUdpMessage();
		m_inputBuffer.retrieveAll();
		return;
	}
	m_curConv = fAddrConnIter->second->getConvId();
	KcpConnectionMap::iterator fKcpIter = m_kcpConnections.find(m_curConv);
	TcpConnectionMap::iterator fTcpIter = m_tcpConnections.find(m_curConv);
	assert(fKcpIter != m_kcpConnections.end());
	assert(fTcpIter != m_tcpConnections.end());
	assert(fKcpIter->first == fTcpIter->first);
	assert(fTcpIter->second->connected());
	m_curTcpConn = fTcpIter->second;
	m_curKcpConn = fKcpIter->second;
	handleKcpMessage();
	m_inputBuffer.retrieveAll();
}